

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::generateReject(Session *this,Message *message,int err,int field)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  FieldBase *pFVar4;
  uint64_t uVar5;
  SEQNUM SVar6;
  long *plVar7;
  field_metrics *pfVar8;
  undefined8 *puVar9;
  runtime_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  field_metrics fVar11;
  ulong *puVar12;
  _func_int **pp_Var13;
  _func_int **pp_Var14;
  Session *this_01;
  undefined8 uVar15;
  Header *this_02;
  char *__s;
  string beginString;
  MsgSeqNum msgSeqNum;
  Message reject;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  undefined1 local_2d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  char local_2b8 [16];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [16];
  _Alloc_hider local_278;
  undefined1 local_270 [16];
  string local_260 [16];
  _func_int **local_250 [2];
  string local_240;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 local_200 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined8 local_1d0;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  Message local_188;
  
  local_260._0_8_ = local_250;
  pcVar1 = (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string._M_dataplus.
           _M_p;
  std::__cxx11::string::_M_construct<char*>
            (local_260,pcVar1,
             pcVar1 + (this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string.
                      _M_string_length);
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,&MsgType_Reject,0x1cd8b3);
  local_200._0_8_ = &PTR__FieldBase_001f55c8;
  local_200._8_4_ = 0x23;
  local_1f0._M_dataplus._M_p = local_200 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_200 + 0x10),local_2d8._0_8_,
             (pointer)(local_2d8._8_8_ + local_2d8._0_8_));
  local_1d0 = local_200 + 0x40;
  local_1c8._M_p = (pointer)0x0;
  local_1c0._M_local_buf[0] = '\0';
  local_1b0 = 0;
  uStack_1ac = 0;
  local_200._0_8_ = &PTR__FieldBase_001f6658;
  newMessage(&local_188,this,(MsgType *)local_200);
  FieldBase::~FieldBase((FieldBase *)local_200);
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._M_allocated_capacity + 1));
  }
  this_02 = &message->m_header;
  Message::reverseRoute(&local_188,this_02);
  fill(this,&local_188.m_header);
  UInt64Field::UInt64Field((UInt64Field *)local_200,0x22);
  local_200._0_8_ = &PTR__FieldBase_001f6e60;
  pFVar4 = FieldMap::getFieldRef(&this_02->super_FieldMap,0x23);
  bVar2 = FieldMap::getFieldIfSet(&this_02->super_FieldMap,(FieldBase *)local_200);
  if ((bVar2) && (iVar3 = std::__cxx11::string::compare(local_200 + 0x10), iVar3 != 0)) {
    uVar5 = UInt64Field::getValue((UInt64Field *)local_200);
    UInt64Field::UInt64Field((UInt64Field *)local_2d8,0x2d,uVar5);
    local_2d8._0_8_ = &PTR__FieldBase_001f7170;
    FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_2d8,true);
    FieldBase::~FieldBase((FieldBase *)local_2d8);
  }
  iVar3 = std::__cxx11::string::compare((char *)local_260);
  if (-1 < iVar3) {
    iVar3 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
    if (iVar3 != 0) {
      local_2d8._0_8_ = &PTR__FieldBase_001f55c8;
      local_2d8._8_4_ = 0x174;
      local_2c8._M_allocated_capacity = (size_type)(local_2d8 + 0x20);
      pcVar1 = (pFVar4->m_string)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_2d8 + 0x10),pcVar1,pcVar1 + (pFVar4->m_string)._M_string_length);
      local_2a8._M_p = local_2d8 + 0x40;
      local_2a0 = 0;
      local_298._M_local_buf[0] = '\0';
      local_288._0_4_ = 0;
      local_288._4_4_ = 0;
      local_2d8._0_8_ = &PTR__FieldBase_001f71a8;
      FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_2d8,true);
      FieldBase::~FieldBase((FieldBase *)local_2d8);
    }
    iVar3 = std::__cxx11::string::compare((char *)local_260);
    if (((err < 0xc) && (iVar3 == 0)) ||
       (iVar3 = std::__cxx11::string::compare((char *)local_260), 0 < iVar3)) {
      IntField::IntField((IntField *)local_2d8,0x175,err);
      local_2d8._0_8_ = &PTR__FieldBase_001f71e0;
      FieldMap::setField(&local_188.super_FieldMap,(FieldBase *)local_2d8,true);
      FieldBase::~FieldBase((FieldBase *)local_2d8);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)&pFVar4->m_string);
  if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&pFVar4->m_string), iVar3 != 0)
     ) {
    uVar5 = UInt64Field::getValue((UInt64Field *)local_200);
    SVar6 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
    if (uVar5 == SVar6) {
      SessionState::incrNextTargetMsgSeqNum(&this->m_state);
    }
  }
  switch(err) {
  case 0:
    __s = "Invalid tag number";
    goto LAB_001a7e8c;
  case 1:
    __s = "Required tag missing";
    break;
  case 2:
    __s = "Tag not defined for this message type";
    break;
  default:
    std::operator+(&local_2f8,"Message ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_200 + 0x10));
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    pp_Var14 = (_func_int **)(puVar9 + 2);
    if ((_func_int **)*puVar9 == pp_Var14) {
      local_2c8._M_allocated_capacity = (size_type)*pp_Var14;
      local_2c8._8_8_ = puVar9[3];
      local_2d8._0_8_ = local_2d8 + 0x10;
    }
    else {
      local_2c8._M_allocated_capacity = (size_type)*pp_Var14;
      local_2d8._0_8_ = (_func_int **)*puVar9;
    }
    local_2d8._8_8_ = puVar9[1];
    *puVar9 = pp_Var14;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    SessionState::onEvent(&this->m_state,(string *)local_2d8);
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    local_1a8.field_2._M_allocated_capacity = local_2f8.field_2._M_allocated_capacity;
    local_1a8._M_dataplus._M_p = local_2f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p == &local_2f8.field_2) goto LAB_001a82e3;
    goto LAB_001a82db;
  case 4:
    __s = "Tag specified without a value";
    break;
  case 5:
    __s = "Value is incorrect (out of range) for this tag";
    break;
  case 6:
    __s = "Incorrect data format for value";
    break;
  case 9:
    __s = "CompID problem";
    break;
  case 10:
    __s = "SendingTime accuracy problem";
    break;
  case 0xb:
    __s = "Invalid MsgType";
    break;
  case 0xd:
    __s = "Tag appears more than once";
    break;
  case 0xe:
    __s = "Tag specified out of required order";
    break;
  case 0x10:
    __s = "Incorrect NumInGroup count for repeating group";
  }
  if (field == 0) {
    this_01 = (Session *)local_2d8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_01,__s,(allocator<char> *)&local_2f8);
    pp_Var14 = (_func_int **)(local_2d8 + 0x10);
    populateRejectReason(this_01,&local_188,(string *)local_2d8);
    if ((_func_int **)local_2d8._0_8_ != pp_Var14) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_288 + 8),"Message ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_200 + 0x10));
    pfVar8 = (field_metrics *)std::__cxx11::string::append(local_288 + 8);
    fVar11 = (field_metrics)(pfVar8 + 2);
    if (*pfVar8 == fVar11) {
      local_2f8.field_2._M_allocated_capacity = *(undefined8 *)fVar11;
      local_2f8.field_2._8_8_ = pfVar8[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *(undefined8 *)fVar11;
      local_2f8._M_dataplus._M_p = (pointer)*pfVar8;
    }
    local_2f8._M_string_length = *(size_type *)(pfVar8 + 1);
    *pfVar8 = fVar11;
    pfVar8[1].m_length = 0;
    pfVar8[1].m_checksum = 0;
    *(undefined1 *)&pfVar8[2].m_length = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    pp_Var13 = (_func_int **)(puVar9 + 2);
    if ((_func_int **)*puVar9 == pp_Var13) {
      local_2c8._M_allocated_capacity = (size_type)*pp_Var13;
      local_2c8._8_8_ = puVar9[3];
      local_2d8._0_8_ = pp_Var14;
    }
    else {
      local_2c8._M_allocated_capacity = (size_type)*pp_Var13;
      local_2d8._0_8_ = (_func_int **)*puVar9;
    }
    local_2d8._8_8_ = puVar9[1];
    *puVar9 = pp_Var13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    SessionState::onEvent(&this->m_state,(string *)local_2d8);
    if ((_func_int **)local_2d8._0_8_ != pp_Var14) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    local_1a8.field_2._M_allocated_capacity = local_270._0_8_;
    local_1a8._M_dataplus._M_p = (pointer)local_288._8_8_;
    if ((undefined1 *)local_288._8_8_ == local_270) goto LAB_001a82e3;
  }
  else {
LAB_001a7e8c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2d8,__s,(allocator<char> *)&local_2f8);
    populateRejectReason(this,&local_188,field,(string *)local_2d8);
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    std::operator+(&local_1a8,"Message ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_200 + 0x10));
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar10) {
      local_210._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_210._8_8_ = plVar7[3];
      local_220._M_p = (pointer)&local_210;
    }
    else {
      local_210._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_220._M_p = (pointer)*plVar7;
    }
    local_218 = plVar7[1];
    *plVar7 = (long)paVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_220);
    puVar12 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_270._0_8_ = *puVar12;
      local_270._8_8_ = plVar7[3];
      local_288._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_270;
    }
    else {
      local_270._0_8_ = *puVar12;
      local_288._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_278._M_p = (pointer)plVar7[1];
    *plVar7 = (long)puVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pfVar8 = (field_metrics *)std::__cxx11::string::append(local_288 + 8);
    paVar10 = &local_2f8.field_2;
    fVar11 = (field_metrics)(pfVar8 + 2);
    if (*pfVar8 == fVar11) {
      local_2f8.field_2._M_allocated_capacity = *(undefined8 *)fVar11;
      local_2f8.field_2._8_8_ = pfVar8[3];
      local_2f8._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *(undefined8 *)fVar11;
      local_2f8._M_dataplus._M_p = (pointer)*pfVar8;
    }
    local_2f8._M_string_length = *(size_type *)(pfVar8 + 1);
    *pfVar8 = fVar11;
    pfVar8[1].m_length = 0;
    pfVar8[1].m_checksum = 0;
    *(undefined1 *)&pfVar8[2].m_length = 0;
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_240,(IntTConvertor<unsigned_long> *)(long)field,local_2f8._M_string_length);
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      uVar15 = local_2f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_240._M_string_length + local_2f8._M_string_length) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        uVar15 = local_240.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_240._M_string_length + local_2f8._M_string_length)
      goto LAB_001a8101;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_240,0,(char *)0x0,(ulong)local_2f8._M_dataplus._M_p);
    }
    else {
LAB_001a8101:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_240._M_dataplus._M_p)
      ;
    }
    pp_Var14 = (_func_int **)(puVar9 + 2);
    if ((_func_int **)*puVar9 == pp_Var14) {
      local_2c8._M_allocated_capacity = (size_type)*pp_Var14;
      local_2c8._8_8_ = puVar9[3];
      local_2d8._0_8_ = local_2d8 + 0x10;
    }
    else {
      local_2c8._M_allocated_capacity = (size_type)*pp_Var14;
      local_2d8._0_8_ = (_func_int **)*puVar9;
    }
    local_2d8._8_8_ = puVar9[1];
    *puVar9 = pp_Var14;
    puVar9[1] = 0;
    *(undefined1 *)pp_Var14 = 0;
    SessionState::onEvent(&this->m_state,(string *)local_2d8);
    if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
      operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar10) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270) {
      operator_delete((void *)local_288._8_8_,local_270._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_p != &local_210) {
      operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_001a82e3;
  }
LAB_001a82db:
  operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
LAB_001a82e3:
  if ((this->m_state).m_receivedLogon != false) {
    sendRaw(this,&local_188,0);
    FieldBase::~FieldBase((FieldBase *)local_200);
    Message::~Message(&local_188);
    if ((_func_int ***)local_260._0_8_ != local_250) {
      operator_delete((void *)local_260._0_8_,(long)local_250[0] + 1);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Tried to send a reject while not logged on");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Session::generateReject(const Message &message, int err, int field) {
  std::string beginString = m_sessionID.getBeginString();

  Message reject = newMessage(MsgType(MsgType_Reject));

  reject.reverseRoute(message.getHeader());
  fill(reject.getHeader());

  MsgSeqNum msgSeqNum;

  auto const &msgType = message.getHeader().getField<MsgType>();
  if (message.getHeader().getFieldIfSet(msgSeqNum)) {
    if (msgSeqNum.getString() != "") {
      reject.setField(RefSeqNum(msgSeqNum));
    }
  }

  if (beginString >= FIX::BeginString_FIX42) {
    if (msgType.getString() != "") {
      reject.setField(RefMsgType(msgType));
    }
    if ((beginString == FIX::BeginString_FIX42 && err <= SessionRejectReason_INVALID_MSGTYPE)
        || beginString > FIX::BeginString_FIX42) {
      reject.setField(SessionRejectReason(err));
    }
  }
  if (msgType != MsgType_Logon && msgType != MsgType_SequenceReset && msgSeqNum == getExpectedTargetNum()) {
    m_state.incrNextTargetMsgSeqNum();
  }

  const char *reason = 0;
  switch (err) {
  case SessionRejectReason_INVALID_TAG_NUMBER:
    reason = SessionRejectReason_INVALID_TAG_NUMBER_TEXT;
    break;
  case SessionRejectReason_REQUIRED_TAG_MISSING:
    reason = SessionRejectReason_REQUIRED_TAG_MISSING_TEXT;
    break;
  case SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE:
    reason = SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE_TEXT;
    break;
  case SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE:
    reason = SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE_TEXT;
    break;
  case SessionRejectReason_VALUE_IS_INCORRECT:
    reason = SessionRejectReason_VALUE_IS_INCORRECT_TEXT;
    break;
  case SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE:
    reason = SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE_TEXT;
    break;
  case SessionRejectReason_COMPID_PROBLEM:
    reason = SessionRejectReason_COMPID_PROBLEM_TEXT;
    break;
  case SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM:
    reason = SessionRejectReason_SENDINGTIME_ACCURACY_PROBLEM_TEXT;
    break;
  case SessionRejectReason_INVALID_MSGTYPE:
    reason = SessionRejectReason_INVALID_MSGTYPE_TEXT;
    break;
  case SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE:
    reason = SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE_TEXT;
    break;
  case SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER:
    reason = SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER_TEXT;
    break;
  case SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP:
    reason = SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP_TEXT;
    break;
  };

  if (reason && (field || err == SessionRejectReason_INVALID_TAG_NUMBER)) {
    populateRejectReason(reject, field, reason);
    m_state.onEvent(
        "Message " + msgSeqNum.getString() + " Rejected: " + reason + ":" + SEQNUM_CONVERTOR::convert(field));
  } else if (reason) {
    populateRejectReason(reject, reason);
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected: " + reason);
  } else {
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected");
  }

  if (!m_state.receivedLogon()) {
    throw std::runtime_error("Tried to send a reject while not logged on");
  }

  sendRaw(reject);
}